

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentEditor.cpp
# Opt level: O0

void __thiscall
InstrumentEditor::InstrumentEditor
          (InstrumentEditor *this,Module *mod,InstrumentListModel *model,
          WaveListModel *waveListModel,PianoInput *input,QWidget *parent)

{
  value_type pSVar1;
  initializer_list<QString> args;
  QGroupBox *pQVar2;
  QVBoxLayout *pQVar3;
  QComboBox *pQVar4;
  QCheckBox *pQVar5;
  EnvelopeForm *pEVar6;
  QHBoxLayout *pQVar7;
  QPushButton *pQVar8;
  QWidget *pQVar9;
  QTabWidget *pQVar10;
  SequenceEditor *this_00;
  reference ppSVar11;
  anon_class_8_1_8991fb9c_for_function slot;
  Function slot_00;
  ConnectionType type;
  QString *local_458;
  undefined1 local_300 [16];
  undefined8 local_2f0;
  InstrumentEditor *local_2e8;
  Object local_2e0 [8];
  code *local_2d8;
  undefined8 uStack_2d0;
  Object *local_2c8;
  code *local_2b8;
  undefined8 local_2b0;
  Object local_2a8 [8];
  QObject *local_2a0;
  InstrumentEditor *local_290;
  code *local_288;
  undefined8 local_280;
  Object local_278 [8];
  code *local_270;
  undefined8 local_268;
  InstrumentEditor *local_260;
  Object local_258 [8];
  QString local_250;
  QString local_238;
  QString local_220;
  QString local_208;
  ulong local_1f0;
  size_t i;
  QString local_1e0;
  QString local_1c8;
  QString local_1b0;
  QString local_198;
  undefined1 local_180 [40];
  QFlags<Qt::AlignmentFlag> local_158;
  QFlags<Qt::AlignmentFlag> local_154;
  QFlags<Qt::AlignmentFlag> local_150;
  QFlags<Qt::AlignmentFlag> local_14c;
  QHBoxLayout *local_148;
  QHBoxLayout *settingsLayout;
  QVBoxLayout *layout;
  QFlags<Qt::AlignmentFlag> local_130;
  undefined1 local_129;
  QString local_128;
  QHBoxLayout *local_110;
  QHBoxLayout *layout_3;
  QString local_100;
  QFlags<Qt::AlignmentFlag> local_e4;
  QVBoxLayout *local_e0;
  QVBoxLayout *layout_2;
  QString local_d0;
  QFlags<Qt::AlignmentFlag> local_b4;
  QFlags<Qt::AlignmentFlag> local_b0;
  undefined1 local_a9;
  QString local_a8;
  QVBoxLayout *local_90;
  QVBoxLayout *layout_1;
  QString local_80;
  QGroupBox *local_68;
  QGroupBox *channelGroup;
  QString local_50;
  QWidget *local_38;
  QWidget *parent_local;
  PianoInput *input_local;
  WaveListModel *waveListModel_local;
  InstrumentListModel *model_local;
  Module *mod_local;
  InstrumentEditor *this_local;
  
  local_38 = parent;
  parent_local = (QWidget *)input;
  input_local = (PianoInput *)waveListModel;
  waveListModel_local = (WaveListModel *)model;
  model_local = (InstrumentListModel *)mod;
  mod_local = (Module *)this;
  BaseEditor::BaseEditor(&this->super_BaseEditor,&model->super_BaseTableModel,input,parent);
  *(undefined ***)&(this->super_BaseEditor).super_PersistantDialog = &PTR_metaObject_002d57d0;
  *(undefined ***)&(this->super_BaseEditor).super_PersistantDialog.field_0x10 =
       &PTR__InstrumentEditor_002d59b0;
  this->mModule = (Module *)model_local;
  this->mWaveListModel = (WaveListModel *)input_local;
  this->mChannelCombo = (QComboBox *)0x0;
  this->mSetEnvelopeCheck = (QCheckBox *)0x0;
  this->mEnvelopeGroup = (QGroupBox *)0x0;
  this->mEnvelopeForm = (EnvelopeForm *)0x0;
  this->mWaveformGroup = (QGroupBox *)0x0;
  this->mWaveformCombo = (QComboBox *)0x0;
  this->mWaveformEditButton = (QPushButton *)0x0;
  this->mSequenceTabs = (QTabWidget *)0x0;
  (this->mSequenceEditors)._M_elems[2] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[3] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[0] = (SequenceEditor *)0x0;
  (this->mSequenceEditors)._M_elems[1] = (SequenceEditor *)0x0;
  std::shared_ptr<trackerboy::Instrument>::shared_ptr(&this->mInstrument,(nullptr_t)0x0);
  this->mCanEdit = true;
  tr(&local_50,"Instrument editor",(char *)0x0,-1);
  QWidget::setWindowTitle((QString *)this);
  QString::~QString(&local_50);
  pQVar2 = (QGroupBox *)operator_new(0x28);
  layout_1._7_1_ = 1;
  tr(&local_80,"Channel",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar2,(QString *)&local_80,(QWidget *)0x0);
  layout_1._7_1_ = 0;
  QString::~QString(&local_80);
  local_68 = pQVar2;
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  local_90 = pQVar3;
  pQVar4 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar4,(QWidget *)0x0);
  this->mChannelCombo = pQVar4;
  pQVar5 = (QCheckBox *)operator_new(0x28);
  local_a9 = 1;
  tr(&local_a8,InstrumentEditorTU::SET_VOLUME_CHECK_STR,(char *)0x0,-1);
  QCheckBox::QCheckBox(pQVar5,(QString *)&local_a8,(QWidget *)0x0);
  local_a9 = 0;
  this->mSetEnvelopeCheck = pQVar5;
  QString::~QString(&local_a8);
  pQVar3 = local_90;
  pQVar4 = this->mChannelCombo;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_b0);
  QBoxLayout::addWidget((QWidget *)pQVar3,(int)pQVar4,(QFlags_conflict1 *)0x0);
  pQVar3 = local_90;
  pQVar5 = this->mSetEnvelopeCheck;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_b4);
  QBoxLayout::addWidget((QWidget *)pQVar3,(int)pQVar5,(QFlags_conflict1 *)0x0);
  QBoxLayout::addStretch((int)local_90);
  QWidget::setLayout((QLayout *)local_68);
  pQVar2 = (QGroupBox *)operator_new(0x28);
  layout_2._7_1_ = 1;
  tr(&local_d0,"Volume envelope",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar2,(QString *)&local_d0,(QWidget *)0x0);
  layout_2._7_1_ = 0;
  this->mEnvelopeGroup = pQVar2;
  QString::~QString(&local_d0);
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  local_e0 = pQVar3;
  pEVar6 = (EnvelopeForm *)operator_new(0x140);
  EnvelopeForm::EnvelopeForm(pEVar6,(QWidget *)0x0);
  pQVar3 = local_e0;
  this->mEnvelopeForm = pEVar6;
  pEVar6 = this->mEnvelopeForm;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_e4);
  QBoxLayout::addWidget((QWidget *)pQVar3,(int)pEVar6,(QFlags_conflict1 *)0x0);
  QBoxLayout::addStretch((int)local_e0);
  QLayout::setContentsMargins((int)local_e0,0,0,0);
  QWidget::setLayout((QLayout *)this->mEnvelopeGroup);
  pQVar2 = (QGroupBox *)operator_new(0x28);
  layout_3._7_1_ = 1;
  tr(&local_100,"Waveform",(char *)0x0,-1);
  QGroupBox::QGroupBox(pQVar2,(QString *)&local_100,(QWidget *)0x0);
  layout_3._7_1_ = 0;
  this->mWaveformGroup = pQVar2;
  QString::~QString(&local_100);
  pQVar7 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar7);
  local_110 = pQVar7;
  pQVar4 = (QComboBox *)operator_new(0x28);
  QComboBox::QComboBox(pQVar4,(QWidget *)0x0);
  this->mWaveformCombo = pQVar4;
  (**(code **)(*(long *)this->mWaveformCombo + 0x1a0))(this->mWaveformCombo,this->mWaveListModel);
  pQVar8 = (QPushButton *)operator_new(0x28);
  local_129 = 1;
  tr(&local_128,"Edit",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar8,(QString *)&local_128,(QWidget *)0x0);
  local_129 = 0;
  this->mWaveformEditButton = pQVar8;
  QString::~QString(&local_128);
  QPushButton::setAutoDefault(SUB81(this->mWaveformEditButton,0));
  QPushButton::setDefault(SUB81(this->mWaveformEditButton,0));
  pQVar7 = local_110;
  pQVar4 = this->mWaveformCombo;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_130);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar4,(QFlags_conflict1 *)0x1);
  pQVar7 = local_110;
  pQVar8 = this->mWaveformEditButton;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&layout + 4));
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar8,(QFlags_conflict1 *)0x0);
  pQVar9 = (QWidget *)(local_110 + 0x10);
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)&layout,AlignTop);
  QLayoutItem::setAlignment((QFlags_conflict1 *)pQVar9);
  QWidget::setLayout((QLayout *)this->mWaveformGroup);
  pQVar10 = (QTabWidget *)operator_new(0x28);
  QTabWidget::QTabWidget(pQVar10,(QWidget *)0x0);
  this->mSequenceTabs = pQVar10;
  pQVar3 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar3);
  settingsLayout = (QHBoxLayout *)pQVar3;
  pQVar7 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar7);
  pQVar2 = local_68;
  local_148 = pQVar7;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_14c);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar2,(QFlags_conflict1 *)0x0);
  pQVar7 = local_148;
  pQVar2 = this->mEnvelopeGroup;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_150);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar2,(QFlags_conflict1 *)0x1);
  pQVar7 = local_148;
  pQVar2 = this->mWaveformGroup;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_154);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar2,(QFlags_conflict1 *)0x1);
  QBoxLayout::addLayout((QLayout *)settingsLayout,(int)local_148);
  pQVar7 = settingsLayout;
  pQVar10 = this->mSequenceTabs;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_158);
  QBoxLayout::addWidget((QWidget *)pQVar7,(int)pQVar10,(QFlags_conflict1 *)0x1);
  QLayout::setContentsMargins((int)settingsLayout,0,0,0);
  pQVar9 = BaseEditor::editorWidget(&this->super_BaseEditor);
  QWidget::setLayout((QLayout *)pQVar9);
  QWidget::hide();
  QWidget::setEnabled(SUB81(this->mWaveformGroup,0));
  QWidget::setEnabled(SUB81(this->mEnvelopeGroup,0));
  pQVar4 = this->mChannelCombo;
  i = (size_t)&local_1e0;
  tr((QString *)i,"CH1 - Duty",(char *)0x0,-1);
  i = (size_t)&local_1c8;
  tr((QString *)i,"CH2 - Duty",(char *)0x0,-1);
  i = (size_t)&local_1b0;
  tr((QString *)i,"CH3 - Wave",(char *)0x0,-1);
  i = (size_t)&local_198;
  tr((QString *)i,"CH4 - Noise",(char *)0x0,-1);
  local_180._0_8_ = &local_1e0;
  local_180._8_8_ = (char16_t *)0x4;
  args._M_len = 4;
  args._M_array = (iterator)local_180._0_8_;
  QList<QString>::QList((QList<QString> *)(local_180 + 0x10),args);
  QComboBox::addItems(pQVar4,(QStringList *)(local_180 + 0x10));
  QList<QString>::~QList((QList<QString> *)(local_180 + 0x10));
  local_458 = (QString *)local_180;
  do {
    local_458 = local_458 + -1;
    QString::~QString(local_458);
  } while (local_458 != &local_1e0);
  for (local_1f0 = 0; local_1f0 < 4; local_1f0 = local_1f0 + 1) {
    this_00 = (SequenceEditor *)operator_new(0x50);
    SequenceEditor::SequenceEditor(this_00,(Module *)model_local,local_1f0,(QWidget *)0x0);
    ppSVar11 = std::array<SequenceEditor_*,_4UL>::operator[](&this->mSequenceEditors,local_1f0);
    *ppSVar11 = this_00;
  }
  pQVar9 = (QWidget *)this->mSequenceTabs;
  ppSVar11 = std::array<SequenceEditor_*,_4UL>::operator[](&this->mSequenceEditors,0);
  pSVar1 = *ppSVar11;
  tr(&local_208,"Arpeggio",(char *)0x0,-1);
  QTabWidget::addTab(pQVar9,(QString *)pSVar1);
  QString::~QString(&local_208);
  pQVar9 = (QWidget *)this->mSequenceTabs;
  ppSVar11 = std::array<SequenceEditor_*,_4UL>::operator[](&this->mSequenceEditors,1);
  pSVar1 = *ppSVar11;
  tr(&local_220,"Panning",(char *)0x0,-1);
  QTabWidget::addTab(pQVar9,(QString *)pSVar1);
  QString::~QString(&local_220);
  pQVar9 = (QWidget *)this->mSequenceTabs;
  ppSVar11 = std::array<SequenceEditor_*,_4UL>::operator[](&this->mSequenceEditors,2);
  pSVar1 = *ppSVar11;
  tr(&local_238,"Pitch",(char *)0x0,-1);
  QTabWidget::addTab(pQVar9,(QString *)pSVar1);
  QString::~QString(&local_238);
  pQVar9 = (QWidget *)this->mSequenceTabs;
  ppSVar11 = std::array<SequenceEditor_*,_4UL>::operator[](&this->mSequenceEditors,3);
  pSVar1 = *ppSVar11;
  tr(&local_250,InstrumentEditorTU::DUTY_CYCLE_STR,(char *)0x0,-1);
  QTabWidget::addTab(pQVar9,(QString *)pSVar1);
  QString::~QString(&local_250);
  local_270 = QAbstractButton::toggled;
  local_268 = 0;
  type = (ConnectionType)this;
  local_260 = this;
  QObject::
  connect<void(QAbstractButton::*)(bool),InstrumentEditor::InstrumentEditor(Module&,TableModel<trackerboy::Instrument>&,TableModel<trackerboy::Waveform>&,PianoInput_const&,QWidget*)::__0>
            (local_258,(offset_in_QAbstractButton_to_subr)this->mSetEnvelopeCheck,
             (QObject *)QAbstractButton::toggled,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_258);
  pQVar4 = this->mChannelCombo;
  local_288 = QComboBox::currentIndexChanged;
  local_280 = 0;
  local_2a0 = (QObject *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
  local_290 = this;
  QObject::
  connect<void(QComboBox::*)(int),InstrumentEditor::InstrumentEditor(Module&,TableModel<trackerboy::Instrument>&,TableModel<trackerboy::Waveform>&,PianoInput_const&,QWidget*)::__1>
            (local_278,(offset_in_QComboBox_to_subr)pQVar4,local_2a0,slot,type);
  QMetaObject::Connection::~Connection((Connection *)local_278);
  pQVar4 = this->mWaveformCombo;
  local_2b8 = QComboBox::currentIndexChanged;
  local_2b0._0_1_ = (QLabel)0x0;
  local_2b0._1_7_ = 0;
  local_2c8 = (Object *)
              QNonConstOverload<int>::operator()
                        ((QNonConstOverload<int> *)&qOverload<int>,
                         (offset_in_QComboBox_to_subr)QComboBox::currentIndexChanged);
  local_2d8 = setEnvelopeToWaveform;
  uStack_2d0._0_1_ = (QGridLayout)0x0;
  uStack_2d0._1_7_ = 0;
  QObject::connect<void(QComboBox::*)(int),void(InstrumentEditor::*)(int)>
            (local_2a8,(offset_in_QComboBox_to_subr)pQVar4,local_2c8,slot_00,type);
  QMetaObject::Connection::~Connection((Connection *)local_2a8);
  local_300._8_8_ = QAbstractButton::clicked;
  local_2f0 = 0;
  local_2e8 = this;
  QObject::
  connect<void(QAbstractButton::*)(bool),InstrumentEditor::InstrumentEditor(Module&,TableModel<trackerboy::Instrument>&,TableModel<trackerboy::Waveform>&,PianoInput_const&,QWidget*)::__2>
            (local_2e0,(offset_in_QAbstractButton_to_subr)this->mWaveformEditButton,
             (QObject *)QAbstractButton::clicked,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_2e0);
  QObject::connect<void(EnvelopeForm::*)(unsigned_char),void(InstrumentEditor::*)(unsigned_char)>
            ((Object *)local_300,(offset_in_EnvelopeForm_to_subr)this->mEnvelopeForm,
             (Object *)EnvelopeForm::envelopeChanged,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_300);
  return;
}

Assistant:

InstrumentEditor::InstrumentEditor(
    Module &mod,
    InstrumentListModel &model,
    WaveListModel &waveListModel,
    PianoInput const& input,
    QWidget *parent
) :
    BaseEditor(model, input, parent),
    mModule(mod),
    mWaveListModel(waveListModel),
    mChannelCombo(nullptr),
    mSetEnvelopeCheck(nullptr),
    mEnvelopeGroup(nullptr),
    mEnvelopeForm(nullptr),
    mWaveformGroup(nullptr),
    mWaveformCombo(nullptr),
    mWaveformEditButton(nullptr),
    mSequenceTabs(nullptr),
    mSequenceEditors(),
    mInstrument(nullptr),
    mCanEdit(true)
{
    setWindowTitle(tr("Instrument editor"));
    auto channelGroup = new QGroupBox(tr("Channel"));
    {
        auto layout = new QVBoxLayout;
        mChannelCombo = new QComboBox;
        mSetEnvelopeCheck = new QCheckBox(tr(TU::SET_VOLUME_CHECK_STR));
        layout->addWidget(mChannelCombo);
        layout->addWidget(mSetEnvelopeCheck);
        layout->addStretch();
        channelGroup->setLayout(layout);
    }

    mEnvelopeGroup = new QGroupBox(tr("Volume envelope"));
    {
        auto layout = new QVBoxLayout;
        mEnvelopeForm = new EnvelopeForm;
        layout->addWidget(mEnvelopeForm);
        layout->addStretch();
        layout->setContentsMargins(0, 0, 0, 0);
        mEnvelopeGroup->setLayout(layout);
    }

    mWaveformGroup = new QGroupBox(tr("Waveform"));
    {
        auto layout = new QHBoxLayout;
        mWaveformCombo = new QComboBox;
        mWaveformCombo->setModel(&mWaveListModel);
        mWaveformEditButton = new QPushButton(tr("Edit"));
        mWaveformEditButton->setAutoDefault(false);
        mWaveformEditButton->setDefault(false);
        layout->addWidget(mWaveformCombo, 1);
        layout->addWidget(mWaveformEditButton);
        layout->setAlignment(Qt::AlignTop);
        mWaveformGroup->setLayout(layout);

        
    }

    mSequenceTabs = new QTabWidget;

    auto layout = new QVBoxLayout;
    auto settingsLayout = new QHBoxLayout;
    settingsLayout->addWidget(channelGroup);
    settingsLayout->addWidget(mEnvelopeGroup, 1);
    settingsLayout->addWidget(mWaveformGroup, 1);
    layout->addLayout(settingsLayout);
    layout->addWidget(mSequenceTabs, 1);
    layout->setContentsMargins(0, 0, 0, 0);
    editorWidget()->setLayout(layout);
    
    mWaveformGroup->hide();
    mWaveformGroup->setEnabled(false);
    mEnvelopeGroup->setEnabled(false);
    
    mChannelCombo->addItems({
        tr("CH1 - Duty"),
        tr("CH2 - Duty"),
        tr("CH3 - Wave"),
        tr("CH4 - Noise")
    });

    for (size_t i = 0; i < trackerboy::Instrument::SEQUENCE_COUNT; ++i) {
        mSequenceEditors[i] = new SequenceEditor(mod, i);
    }
    

    mSequenceTabs->addTab(mSequenceEditors[0], tr("Arpeggio"));
    mSequenceTabs->addTab(mSequenceEditors[1], tr("Panning"));
    mSequenceTabs->addTab(mSequenceEditors[2], tr("Pitch"));
    mSequenceTabs->addTab(mSequenceEditors[3], tr(TU::DUTY_CYCLE_STR));
    

    connect(mSetEnvelopeCheck, &QCheckBox::toggled, this,
        [this](bool checked) {
            mEnvelopeGroup->setEnabled(checked);
            mWaveformGroup->setEnabled(checked);
            setEnvelopeEnable(checked);
        });

    connect(mChannelCombo, qOverload<int>(&QComboBox::currentIndexChanged), this,
        [this](int index) {
            if (index == -1) {
                return;
            }
            setChannel(index);
            
            auto const isWave = index == 2;
            mWaveformGroup->setVisible(isWave);
            mEnvelopeGroup->setVisible(!isWave);

            switch (index) {
                case 0:
                case 1:
                    mSequenceTabs->setTabText(3, tr(TU::DUTY_CYCLE_STR));
                    break;
                case 2:
                    mSequenceTabs->setTabText(3, tr("Volume"));
                    break;
                case 3:
                    mSequenceTabs->setTabText(3, tr("Noise"));
                    break;
            }

            if (isWave) {
                setEnvelopeToWaveform(mWaveformCombo->currentIndex());
                mSetEnvelopeCheck->setText(tr(TU::SET_WAVE_CHECK_STR));
            } else {
                setEnvelope(mEnvelopeForm->envelope());
                mSetEnvelopeCheck->setText(tr(TU::SET_VOLUME_CHECK_STR));
            }

        });

    
    connect(mWaveformCombo, qOverload<int>(&QComboBox::currentIndexChanged), this, &InstrumentEditor::setEnvelopeToWaveform);

    connect(mWaveformEditButton, &QPushButton::clicked, this,
        [this]() {
            emit openWaveEditor(mWaveformCombo->currentIndex());
        });

    connect(mEnvelopeForm, &EnvelopeForm::envelopeChanged, this, &InstrumentEditor::setEnvelope);

}